

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListenThread.cpp
# Opt level: O0

void __thiscall
brynet::net::ListenThread::startListen
          (ListenThread *this,bool isIPV6,string *ip,int port,ACCEPT_CALLBACK *callback)

{
  bool bVar1;
  char *ip_00;
  runtime_error *prVar2;
  int *piVar3;
  shared_ptr<bool> local_e0;
  shared_ptr<brynet::net::ListenSocket> local_d0;
  function<void_(std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>)>
  local_c0;
  undefined1 local_a0 [24];
  shared_ptr<bool> isRunListen;
  undefined1 local_78 [8];
  shared_ptr<brynet::net::ListenSocket> listenSocket;
  shared_ptr<bool> local_60;
  sock local_50;
  sock fd;
  undefined4 local_3c;
  lock_guard<std::mutex> local_38;
  lock_guard<std::mutex> lck;
  ACCEPT_CALLBACK *callback_local;
  int port_local;
  string *ip_local;
  bool isIPV6_local;
  ListenThread *this_local;
  
  lck._M_device = (mutex_type *)callback;
  std::lock_guard<std::mutex>::lock_guard(&local_38,&this->mListenThreadGuard);
  bVar1 = std::operator!=(&this->mListenThread,(nullptr_t)0x0);
  if (bVar1) {
    local_3c = 1;
  }
  else {
    bVar1 = std::operator==(callback,(nullptr_t)0x0);
    if (bVar1) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"accept callback is nullptr");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    ip_00 = (char *)std::__cxx11::string::c_str();
    local_50 = base::Listen(isIPV6,ip_00,port,0x200);
    if (local_50 == -1) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      piVar3 = __errno_location();
      std::runtime_error::runtime_error(prVar2,"listen error of:" + *piVar3);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this->mIsIPV6 = isIPV6;
    listenSocket.super___shared_ptr<brynet::net::ListenSocket,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._7_1_ = 1;
    std::make_shared<bool,bool>((bool *)&local_60);
    std::shared_ptr<bool>::operator=(&this->mRunListen,&local_60);
    std::shared_ptr<bool>::~shared_ptr(&local_60);
    std::__cxx11::string::operator=((string *)&this->mIP,(string *)ip);
    this->mPort = port;
    ListenSocket::Create
              ((ListenSocket *)
               &isRunListen.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               local_50);
    std::shared_ptr<brynet::net::ListenSocket>::
    shared_ptr<brynet::net::ListenSocket,brynet::net::ListenSocket::ListenSocketDeleter,void>
              ((shared_ptr<brynet::net::ListenSocket> *)local_78,
               (unique_ptr<brynet::net::ListenSocket,_brynet::net::ListenSocket::ListenSocketDeleter>
                *)&isRunListen.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::unique_ptr<brynet::net::ListenSocket,_brynet::net::ListenSocket::ListenSocketDeleter>::
    ~unique_ptr((unique_ptr<brynet::net::ListenSocket,_brynet::net::ListenSocket::ListenSocketDeleter>
                 *)&isRunListen.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::shared_ptr<bool>::shared_ptr((shared_ptr<bool> *)(local_a0 + 0x10),&this->mRunListen);
    std::shared_ptr<bool>::shared_ptr(&local_e0,(shared_ptr<bool> *)(local_a0 + 0x10));
    std::shared_ptr<brynet::net::ListenSocket>::shared_ptr
              (&local_d0,(shared_ptr<brynet::net::ListenSocket> *)local_78);
    std::
    function<void_(std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>)>
    ::function(&local_c0,callback);
    std::
    make_shared<std::thread,brynet::net::ListenThread::startListen(bool,std::__cxx11::string_const&,int,std::function<void(std::unique_ptr<brynet::net::TcpSocket,brynet::net::TcpSocket::TcpSocketDeleter>)>)::__0>
              ((type *)local_a0);
    std::shared_ptr<std::thread>::operator=
              (&this->mListenThread,(shared_ptr<std::thread> *)local_a0);
    std::shared_ptr<std::thread>::~shared_ptr((shared_ptr<std::thread> *)local_a0);
    startListen(bool,std::__cxx11::string_const&,int,std::function<void(std::unique_ptr<brynet::net::TcpSocket,brynet::net::TcpSocket::TcpSocketDeleter>)>)
    ::$_0::~__0((__0 *)&local_e0);
    std::shared_ptr<bool>::~shared_ptr((shared_ptr<bool> *)(local_a0 + 0x10));
    std::shared_ptr<brynet::net::ListenSocket>::~shared_ptr
              ((shared_ptr<brynet::net::ListenSocket> *)local_78);
    local_3c = 0;
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_38);
  return;
}

Assistant:

void ListenThread::startListen(bool isIPV6, 
    const std::string& ip,
    int port,
    ACCEPT_CALLBACK callback)
{
    std::lock_guard<std::mutex> lck(mListenThreadGuard);

    if (mListenThread != nullptr)
    {
        return;
    }
    if (callback == nullptr)
    {
        throw std::runtime_error("accept callback is nullptr");
    }

    sock fd = brynet::net::base::Listen(isIPV6, ip.c_str(), port, 512);
    if (fd == SOCKET_ERROR)
    {
        throw std::runtime_error("listen error of:" + sErrno);
    }

    mIsIPV6 = isIPV6;
    mRunListen = std::make_shared<bool>(true);
    mIP = ip;
    mPort = port;

    auto listenSocket = std::shared_ptr<ListenSocket>(ListenSocket::Create(fd));
    auto isRunListen = mRunListen;

    mListenThread = std::make_shared<std::thread>([isRunListen, listenSocket, callback]() mutable {
        while (*isRunListen)
        {
            auto clientSocket = runOnceListen(listenSocket);
            if (clientSocket == nullptr)
            {
                continue;
            }

            if (*isRunListen)
            {
                callback(std::move(clientSocket));
            }
        }
    });
}